

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

LineInterpolationRange __thiscall
tcu::anon_unknown_3::calcLineInterpolationWeightsAxisProjected
          (anon_unknown_3 *this,Vec2 *pa,float wa,Vec2 *pb,float wb,Vec2 *pr)

{
  bool bVar1;
  uint ndx;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float minDivisor;
  float fVar8;
  Vec2 VVar9;
  LineInterpolationRange LVar10;
  float perspectiveDivisorMin;
  float perspectiveDivisorMax;
  float perspectiveInvTMin;
  float perspectiveInvTMax;
  float perspectiveTMin;
  float perspectiveTMax;
  float tMin;
  float tMax;
  float divisorMin;
  float divisorMax;
  float divisor;
  float dividendMin;
  float dividendMax;
  float dividend;
  int majorAxisNdx;
  bool isXMajor;
  int divError;
  int roundError;
  Vec2 *pr_local;
  float wb_local;
  Vec2 *pb_local;
  float wa_local;
  Vec2 *pa_local;
  LineInterpolationRange *returnValue;
  
  bVar1 = isLineXMajor(pa,pb);
  ndx = (uint)!bVar1;
  pfVar2 = Vector<float,_2>::operator[](pr,ndx);
  fVar6 = *pfVar2;
  pfVar2 = Vector<float,_2>::operator[](pa,ndx);
  fVar7 = *pfVar2;
  fVar3 = getMaxValueWithinError(fVar6 - fVar7,1);
  fVar4 = getMinValueWithinError(fVar6 - fVar7,1);
  pfVar2 = Vector<float,_2>::operator[](pb,ndx);
  fVar6 = *pfVar2;
  pfVar2 = Vector<float,_2>::operator[](pa,ndx);
  fVar7 = *pfVar2;
  fVar5 = getMaxValueWithinError(fVar6 - fVar7,1);
  fVar6 = getMinValueWithinError(fVar6 - fVar7,1);
  fVar7 = maximalRangeDivision(fVar4,fVar3,fVar6,fVar5);
  fVar7 = getMaxValueWithinError(fVar7,3);
  fVar6 = minimalRangeDivision(fVar4,fVar3,fVar6,fVar5);
  fVar6 = getMinValueWithinError(fVar6,3);
  fVar3 = maximalRangeDivision(fVar6,fVar7,wb,wb);
  fVar3 = getMaxValueWithinError(fVar3,3);
  fVar4 = minimalRangeDivision(fVar6,fVar7,wb,wb);
  fVar4 = getMinValueWithinError(fVar4,3);
  fVar5 = maximalRangeDivision(1.0 - fVar7,1.0 - fVar6,wa,wa);
  fVar5 = getMaxValueWithinError(fVar5,3);
  fVar6 = minimalRangeDivision(1.0 - fVar7,1.0 - fVar6,wa,wa);
  fVar6 = getMinValueWithinError(fVar6,3);
  fVar7 = getMaxValueWithinError(fVar3 + fVar5,1);
  minDivisor = getMinValueWithinError(fVar4 + fVar6,1);
  LineInterpolationRange::LineInterpolationRange((LineInterpolationRange *)this);
  fVar8 = maximalRangeDivision(fVar6,fVar5,minDivisor,fVar7);
  fVar8 = getMaxValueWithinError(fVar8,3);
  pfVar2 = Vector<float,_2>::x((Vector<float,_2> *)this);
  *pfVar2 = fVar8;
  fVar8 = maximalRangeDivision(fVar4,fVar3,minDivisor,fVar7);
  fVar8 = getMaxValueWithinError(fVar8,3);
  pfVar2 = Vector<float,_2>::y((Vector<float,_2> *)this);
  *pfVar2 = fVar8;
  fVar6 = minimalRangeDivision(fVar6,fVar5,minDivisor,fVar7);
  fVar6 = getMinValueWithinError(fVar6,3);
  pfVar2 = Vector<float,_2>::x((Vector<float,_2> *)(this + 8));
  *pfVar2 = fVar6;
  VVar9.m_data[1] = 0.0;
  VVar9.m_data[0] = fVar3;
  fVar6 = minimalRangeDivision(fVar4,fVar3,minDivisor,fVar7);
  LVar10.max.m_data[0] = getMinValueWithinError(fVar6,3);
  pfVar2 = Vector<float,_2>::y((Vector<float,_2> *)(this + 8));
  LVar10.max.m_data[1] = 0.0;
  *pfVar2 = LVar10.max.m_data[0];
  LVar10.min.m_data[0] = VVar9.m_data[0];
  LVar10.min.m_data[1] = VVar9.m_data[1];
  return LVar10;
}

Assistant:

LineInterpolationRange calcLineInterpolationWeightsAxisProjected (const tcu::Vec2& pa, float wa, const tcu::Vec2& pb, float wb, const tcu::Vec2& pr)
{
	const int	roundError		= 1;
	const int	divError		= 3;
	const bool	isXMajor		= isLineXMajor(pa, pb);
	const int	majorAxisNdx	= (isXMajor) ? (0) : (1);

	// calc weights:
	//			(1-t) / wa					t / wb
	//		-------------------	,	-------------------
	//		(1-t) / wa + t / wb		(1-t) / wa + t / wb

	// Use axis projected (inaccurate) method, i.e. for X-major lines:
	//     (xd - xa) * (xb - xa)      xd - xa
	// t = ---------------------  ==  -------
	//       ( xb - xa ) ^ 2          xb - xa

	// Allow 1 ULP
	const float		dividend	= (pr[majorAxisNdx] - pa[majorAxisNdx]);
	const float		dividendMax	= getMaxValueWithinError(dividend, 1);
	const float		dividendMin	= getMinValueWithinError(dividend, 1);
	DE_ASSERT(dividendMin <= dividendMax);

	// Allow 1 ULP
	const float		divisor		= (pb[majorAxisNdx] - pa[majorAxisNdx]);
	const float		divisorMax	= getMaxValueWithinError(divisor, 1);
	const float		divisorMin	= getMinValueWithinError(divisor, 1);
	DE_ASSERT(divisorMin <= divisorMax);

	// Allow 3 ULP precision for division
	const float		tMax		= getMaxValueWithinError(maximalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	const float		tMin		= getMinValueWithinError(minimalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	DE_ASSERT(tMin <= tMax);

	const float		perspectiveTMax			= getMaxValueWithinError(maximalRangeDivision(tMin, tMax, wb, wb), divError);
	const float		perspectiveTMin			= getMinValueWithinError(minimalRangeDivision(tMin, tMax, wb, wb), divError);
	DE_ASSERT(perspectiveTMin <= perspectiveTMax);

	const float		perspectiveInvTMax		= getMaxValueWithinError(maximalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	const float		perspectiveInvTMin		= getMinValueWithinError(minimalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	DE_ASSERT(perspectiveInvTMin <= perspectiveInvTMax);

	const float		perspectiveDivisorMax	= getMaxValueWithinError(perspectiveTMax + perspectiveInvTMax, roundError);
	const float		perspectiveDivisorMin	= getMinValueWithinError(perspectiveTMin + perspectiveInvTMin, roundError);
	DE_ASSERT(perspectiveDivisorMin <= perspectiveDivisorMax);

	LineInterpolationRange returnValue;
	returnValue.max.x() = getMaxValueWithinError(maximalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.max.y() = getMaxValueWithinError(maximalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.x() = getMinValueWithinError(minimalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.y() = getMinValueWithinError(minimalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());

	return returnValue;
}